

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

void __thiscall
VmaAllocator_T::GetHeapBudgets
          (VmaAllocator_T *this,VmaBudget *outBudgets,uint32_t firstHeap,uint32_t heapCount)

{
  VmaRWMutex *__rwlock;
  uint64_t *puVar1;
  bool bVar2;
  ulong uVar3;
  uint32_t heapIndex;
  long lVar4;
  ulong uVar5;
  long lVar6;
  
  if (this->m_UseExtMemoryBudget == true) {
    do {
      if ((this->m_Budget).m_OperationsSinceBudgetFetch.super___atomic_base<unsigned_int>._M_i <
          0x1e) {
        __rwlock = &(this->m_Budget).m_BudgetMutex;
        bVar2 = this->m_UseMutex;
        if (bVar2 == true) {
          std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)__rwlock);
        }
        if (heapCount != 0) {
          lVar4 = 0;
          do {
            *(__int_type_conflict1 *)((long)&(outBudgets->statistics).blockCount + lVar4) =
                 (this->m_Budget).m_BlockCount[firstHeap].super___atomic_base<unsigned_int>._M_i;
            *(__int_type_conflict1 *)((long)&(outBudgets->statistics).allocationCount + lVar4) =
                 (this->m_Budget).m_AllocationCount[firstHeap].super___atomic_base<unsigned_int>.
                 _M_i;
            *(__int_type_conflict2 *)((long)&(outBudgets->statistics).blockBytes + lVar4) =
                 (this->m_Budget).m_BlockBytes[firstHeap].super___atomic_base<unsigned_long>._M_i;
            *(__int_type_conflict2 *)((long)&(outBudgets->statistics).allocationBytes + lVar4) =
                 (this->m_Budget).m_AllocationBytes[firstHeap].super___atomic_base<unsigned_long>.
                 _M_i;
            uVar5 = *(long *)((long)&(outBudgets->statistics).blockBytes + lVar4) +
                    (this->m_Budget).m_VulkanUsage[firstHeap];
            puVar1 = (this->m_Budget).m_BlockBytesAtBudgetFetch + firstHeap;
            lVar6 = 0;
            if (*puVar1 <= uVar5) {
              lVar6 = uVar5 - *puVar1;
            }
            *(long *)((long)&outBudgets->usage + lVar4) = lVar6;
            uVar5 = (this->m_Budget).m_VulkanBudget[firstHeap];
            uVar3 = (this->m_MemProps).memoryHeaps[firstHeap].size;
            if (uVar3 < uVar5) {
              uVar5 = uVar3;
            }
            *(ulong *)((long)&outBudgets->budget + lVar4) = uVar5;
            firstHeap = firstHeap + 1;
            lVar4 = lVar4 + 0x28;
          } while ((ulong)heapCount * 0x28 != lVar4);
        }
        if (bVar2 == false) {
          return;
        }
        pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
        return;
      }
      UpdateVulkanBudget(this);
    } while (this->m_UseExtMemoryBudget != false);
  }
  if (heapCount != 0) {
    lVar4 = 0;
    do {
      *(__int_type_conflict1 *)((long)&(outBudgets->statistics).blockCount + lVar4) =
           (this->m_Budget).m_BlockCount[firstHeap].super___atomic_base<unsigned_int>._M_i;
      *(__int_type_conflict1 *)((long)&(outBudgets->statistics).allocationCount + lVar4) =
           (this->m_Budget).m_AllocationCount[firstHeap].super___atomic_base<unsigned_int>._M_i;
      *(__int_type_conflict2 *)((long)&(outBudgets->statistics).blockBytes + lVar4) =
           (this->m_Budget).m_BlockBytes[firstHeap].super___atomic_base<unsigned_long>._M_i;
      *(__int_type_conflict2 *)((long)&(outBudgets->statistics).allocationBytes + lVar4) =
           (this->m_Budget).m_AllocationBytes[firstHeap].super___atomic_base<unsigned_long>._M_i;
      *(undefined8 *)((long)&outBudgets->usage + lVar4) =
           *(undefined8 *)((long)&(outBudgets->statistics).blockBytes + lVar4);
      *(ulong *)((long)&outBudgets->budget + lVar4) =
           ((this->m_MemProps).memoryHeaps[firstHeap].size << 3) / 10;
      firstHeap = firstHeap + 1;
      lVar4 = lVar4 + 0x28;
    } while ((ulong)heapCount * 0x28 != lVar4);
  }
  return;
}

Assistant:

void VmaAllocator_T::GetHeapBudgets(VmaBudget* outBudgets, uint32_t firstHeap, uint32_t heapCount)
{
#if VMA_MEMORY_BUDGET
    if(m_UseExtMemoryBudget)
    {
        if(m_Budget.m_OperationsSinceBudgetFetch < 30)
        {
            VmaMutexLockRead lockRead(m_Budget.m_BudgetMutex, m_UseMutex);
            for(uint32_t i = 0; i < heapCount; ++i, ++outBudgets)
            {
                const uint32_t heapIndex = firstHeap + i;

                outBudgets->statistics.blockCount = m_Budget.m_BlockCount[heapIndex];
                outBudgets->statistics.allocationCount = m_Budget.m_AllocationCount[heapIndex];
                outBudgets->statistics.blockBytes = m_Budget.m_BlockBytes[heapIndex];
                outBudgets->statistics.allocationBytes = m_Budget.m_AllocationBytes[heapIndex];

                if(m_Budget.m_VulkanUsage[heapIndex] + outBudgets->statistics.blockBytes > m_Budget.m_BlockBytesAtBudgetFetch[heapIndex])
                {
                    outBudgets->usage = m_Budget.m_VulkanUsage[heapIndex] +
                        outBudgets->statistics.blockBytes - m_Budget.m_BlockBytesAtBudgetFetch[heapIndex];
                }
                else
                {
                    outBudgets->usage = 0;
                }

                // Have to take MIN with heap size because explicit HeapSizeLimit is included in it.
                outBudgets->budget = VMA_MIN(
                    m_Budget.m_VulkanBudget[heapIndex], m_MemProps.memoryHeaps[heapIndex].size);
            }
        }
        else
        {
            UpdateVulkanBudget(); // Outside of mutex lock
            GetHeapBudgets(outBudgets, firstHeap, heapCount); // Recursion
        }
    }
    else
#endif
    {
        for(uint32_t i = 0; i < heapCount; ++i, ++outBudgets)
        {
            const uint32_t heapIndex = firstHeap + i;

            outBudgets->statistics.blockCount = m_Budget.m_BlockCount[heapIndex];
            outBudgets->statistics.allocationCount = m_Budget.m_AllocationCount[heapIndex];
            outBudgets->statistics.blockBytes = m_Budget.m_BlockBytes[heapIndex];
            outBudgets->statistics.allocationBytes = m_Budget.m_AllocationBytes[heapIndex];

            outBudgets->usage = outBudgets->statistics.blockBytes;
            outBudgets->budget = m_MemProps.memoryHeaps[heapIndex].size * 8 / 10; // 80% heuristics.
        }
    }
}